

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborarray.cpp
# Opt level: O1

QDataStream * operator>>(QDataStream *stream,QCborArray *value)

{
  long in_FS_OFFSET;
  QCborArray local_70;
  QByteArray local_68;
  QCborValue local_50;
  QCborParserError local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char *)0x0;
  local_68.d.size = 0;
  operator>>(stream,&local_68);
  local_38.offset = 0;
  local_38.error.c = NoError;
  local_38._12_4_ = 0xaaaaaaaa;
  QCborValue::fromCbor(&local_50,&local_68,&local_38);
  QCborValue::toArray((QCborValue *)&local_70);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::reset
            (&value->d,(QCborContainerPrivate *)local_70.d.d.ptr);
  QCborArray::~QCborArray(&local_70);
  if (local_50.container != (QCborContainerPrivate *)0x0) {
    QCborContainerPrivate::deref(local_50.container);
  }
  if (local_38.error.c != NoError) {
    QDataStream::setStatus(stream,ReadCorruptData);
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return stream;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QCborArray &value)
{
    QByteArray buffer;
    stream >> buffer;
    QCborParserError parseError{};
    value = QCborValue::fromCbor(buffer, &parseError).toArray();
    if (parseError.error)
        stream.setStatus(QDataStream::ReadCorruptData);
    return stream;
}